

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

Float __thiscall pbrt::Triangle::PDF(Triangle *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  float fVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  byte bVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long in_FS_OFFSET;
  float fVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar20;
  undefined1 auVar24 [16];
  Float FVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 extraout_var [56];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  Point3f PVar54;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  undefined1 local_148 [256];
  bool local_48;
  Ray local_40;
  undefined1 extraout_var_00 [56];
  undefined1 auVar32 [56];
  
  auVar21._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar21._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar21._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar21._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  uVar3 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .high),0x10);
  auVar27._0_4_ = (float)uVar3 + auVar21._0_4_;
  auVar27._4_4_ = (float)((ulong)uVar3 >> 0x20) + auVar21._4_4_;
  auVar27._8_4_ = auVar21._8_4_ + 0.0;
  auVar27._12_4_ = auVar21._12_4_ + 0.0;
  auVar24._8_4_ = 0x3f000000;
  auVar24._0_8_ = 0x3f0000003f000000;
  auVar24._12_4_ = 0x3f000000;
  auVar21 = vmulps_avx512vl(auVar27,auVar24);
  uVar3 = vmovlps_avx(auVar21);
  local_148._8_4_ =
       ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  local_148._0_8_ = uVar3;
  FVar25 = SolidAngle(this,(Point3f *)local_148);
  if ((FVar25 < 0.0002) || (6.22 < FVar25)) {
    auVar32 = extraout_var;
    PVar54 = ShapeSampleContext::OffsetRayOrigin(ctx,wi);
    local_40.o.super_Tuple3<pbrt::Point3,_float>.z = PVar54.super_Tuple3<pbrt::Point3,_float>.z;
    auVar31._0_8_ = PVar54.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar31._8_56_ = auVar32;
    local_40.time = ctx->time;
    local_40.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar31._0_16_);
    local_40.d.super_Tuple3<pbrt::Vector3,_float>.z = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
    local_40.d.super_Tuple3<pbrt::Vector3,_float>.x = (wi->super_Tuple3<pbrt::Vector3,_float>).x;
    local_40.d.super_Tuple3<pbrt::Vector3,_float>.y = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
    local_40.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    Intersect((optional<pbrt::ShapeIntersection> *)local_148,this,&local_40,INFINITY);
    if ((PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') &&
       (iVar14 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)
                                      ::reg), iVar14 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg,
                 const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0)
      ;
      __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
    }
    *(long *)(in_FS_OFFSET + -0x260) = *(long *)(in_FS_OFFSET + -0x260) + 1;
    if (local_48 == false) {
      *(long *)(in_FS_OFFSET + -0x268) = *(long *)(in_FS_OFFSET + -0x268) + 1;
      fVar53 = 0.0;
    }
    else {
      FVar25 = Area(this);
      if (local_48 == false) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
      }
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      auVar24 = ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).z);
      auVar21 = vxorps_avx512vl(auVar24,auVar23);
      auVar27 = ZEXT416((uint)((float)local_148._48_4_ * auVar21._0_4_));
      auVar21 = vfnmadd132ss_fma(ZEXT416((uint)local_148._44_4_),auVar27,
                                 ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).y));
      auVar24 = vfnmsub213ss_fma(auVar24,ZEXT416((uint)local_148._48_4_),auVar27);
      auVar21 = vfnmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ + auVar24._0_4_)),
                                 ZEXT416((uint)local_148._40_4_),
                                 ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).x));
      auVar7._8_4_ = 0x7fffffff;
      auVar7._0_8_ = 0x7fffffff7fffffff;
      auVar7._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx512vl(auVar21,auVar7);
      fVar53 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high) * 0.5 -
               ((float)local_148._8_4_ + (float)local_148._12_4_) * 0.5;
      auVar21 = ZEXT416((uint)(((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
                               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5 -
                              ((float)local_148._0_4_ + (float)local_148._4_4_) * 0.5));
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53)),auVar21,auVar21);
      auVar27 = ZEXT416((uint)(((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 -
                              ((float)local_148._16_4_ + (float)local_148._20_4_) * 0.5));
      auVar21 = vfmadd231ss_fma(auVar21,auVar27,auVar27);
      fVar53 = (1.0 / FVar25) / (auVar24._0_4_ / auVar21._0_4_);
      fVar53 = (float)((uint)(ABS(fVar53) != INFINITY) * (int)fVar53);
    }
  }
  else {
    fVar53 = 1.0 / FVar25;
    if (((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
         ((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y != 0.0)) ||
        (fVar1 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z, fVar1 != 0.0)) || (NAN(fVar1))) {
      lVar16 = (long)this->triIndex;
      lVar6 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
      lVar15 = *(long *)(lVar6 + 8);
      lVar6 = *(long *)(lVar6 + 0x10);
      lVar17 = (long)*(int *)(lVar15 + lVar16 * 0xc);
      lVar18 = (long)*(int *)(lVar15 + 4 + lVar16 * 0xc);
      lVar15 = (long)*(int *)(lVar15 + 8 + lVar16 * 0xc);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(lVar6 + 4 + lVar17 * 0xc);
      uVar2 = *(uint *)(lVar6 + lVar18 * 0xc);
      uVar4 = *(ulong *)(lVar6 + 4 + lVar18 * 0xc);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar4;
      uVar5 = *(ulong *)(lVar6 + lVar15 * 0xc);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar5;
      fVar1 = *(float *)(lVar6 + 8 + lVar15 * 0xc);
      auVar24 = ZEXT416(*(uint *)(lVar6 + lVar17 * 0xc));
      auVar21 = vpermi2ps_avx512vl(_DAT_0061de40,auVar33,auVar24);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar2),0x30);
      auVar36._16_8_ = uVar4;
      auVar36._0_16_ = auVar21;
      auVar36._24_8_ = 0;
      auVar29._16_8_ = uVar5;
      auVar29._0_16_ = auVar21;
      auVar29._24_8_ = 0;
      local_148._0_32_ = vshufpd_avx(auVar36,auVar29,2);
      auVar8._0_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      auVar8._4_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar8._8_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar8._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      uVar3 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar21 = vinsertps_avx(auVar8,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
      auVar28._0_4_ = (float)uVar3 + auVar21._0_4_;
      auVar28._4_4_ = (float)((ulong)uVar3 >> 0x20) + auVar21._4_4_;
      auVar28._8_4_ = auVar21._8_4_ + 0.0;
      auVar28._12_4_ = auVar21._12_4_ + 0.0;
      auVar9._8_4_ = 0x3f000000;
      auVar9._0_8_ = 0x3f0000003f000000;
      auVar9._12_4_ = 0x3f000000;
      auVar21 = vmulps_avx512vl(auVar28,auVar9);
      local_40.o.super_Tuple3<pbrt::Point3,_float>.z =
           ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      local_40.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar21);
      local_148._32_4_ = fVar1;
      auVar30._0_8_ =
           InvertSphericalTriangleSample((array<pbrt::Point3<float>,_3> *)local_148,&local_40.o,wi);
      auVar30._8_56_ = extraout_var_00;
      uVar3 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      auVar21 = vinsertps_avx(auVar24,ZEXT416(uVar2),0x10);
      fVar20 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5;
      auVar22._0_4_ =
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar22._4_4_ =
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      auVar22._8_4_ =
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
      auVar22._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
      auVar24 = vinsertps_avx(auVar22,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.high),0x10);
      auVar34._0_4_ = (float)uVar3 + auVar24._0_4_;
      auVar34._4_4_ = (float)((ulong)uVar3 >> 0x20) + auVar24._4_4_;
      auVar34._8_4_ = auVar24._8_4_ + 0.0;
      auVar34._12_4_ = auVar24._12_4_ + 0.0;
      auVar10._8_4_ = 0x3f000000;
      auVar10._0_8_ = 0x3f0000003f000000;
      auVar10._12_4_ = 0x3f000000;
      auVar22 = vmulps_avx512vl(auVar34,auVar10);
      auVar43._4_4_ = fVar20;
      auVar43._0_4_ = fVar20;
      auVar43._8_4_ = fVar20;
      auVar43._12_4_ = fVar20;
      auVar23 = vsubps_avx(auVar21,auVar43);
      auVar7 = vsubps_avx(auVar33,auVar22);
      auVar8 = vsubps_avx(auVar39,auVar22);
      uVar4._0_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
      uVar4._4_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar4;
      auVar21 = vinsertps_avx(auVar7,auVar8,0x1c);
      auVar24 = vinsertps_avx(auVar8,auVar7,0x4c);
      auVar44._0_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar44._4_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar44._8_4_ = auVar21._8_4_ * auVar21._8_4_;
      auVar44._12_4_ = auVar21._12_4_ * auVar21._12_4_;
      auVar21 = vfmadd231ps_fma(auVar44,auVar23,auVar23);
      auVar21 = vfmadd213ps_fma(auVar24,auVar24,auVar21);
      auVar27 = vsqrtps_avx(auVar21);
      uVar42 = auVar27._0_4_;
      auVar46._4_4_ = uVar42;
      auVar46._0_4_ = uVar42;
      auVar46._8_4_ = uVar42;
      auVar46._12_4_ = uVar42;
      auVar21 = vdivps_avx(auVar23,auVar27);
      auVar24 = vdivps_avx(auVar7,auVar46);
      auVar27 = vmovshdup_avx(auVar27);
      auVar45._8_4_ = 0x7fffffff;
      auVar45._0_8_ = 0x7fffffff7fffffff;
      auVar45._12_4_ = 0x7fffffff;
      auVar27 = vdivps_avx(auVar8,auVar27);
      auVar47._0_4_ = (float)(undefined4)uVar4 * auVar27._0_4_;
      auVar47._4_4_ = (float)uVar4._4_4_ * auVar27._4_4_;
      auVar47._8_4_ = auVar27._8_4_ * 0.0;
      auVar47._12_4_ = auVar27._12_4_ * 0.0;
      uVar13 = CONCAT44(auVar47._4_4_,auVar47._0_4_);
      auVar52._0_8_ = uVar13 ^ 0x8000000080000000;
      auVar52._8_4_ = -auVar47._8_4_;
      auVar52._12_4_ = -auVar47._12_4_;
      auVar23 = vpermt2ps_avx512vl(auVar47,_DAT_00603510,auVar52);
      auVar27 = vfmadd231ps_fma(auVar23,auVar35,auVar27);
      auVar40._0_4_ = (float)(undefined4)uVar4 * auVar24._0_4_;
      auVar40._4_4_ = (float)uVar4._4_4_ * auVar24._4_4_;
      auVar40._8_4_ = auVar24._8_4_ * 0.0;
      auVar40._12_4_ = auVar24._12_4_ * 0.0;
      uVar4 = CONCAT44(auVar40._4_4_,auVar40._0_4_);
      auVar51._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar51._8_4_ = -auVar40._8_4_;
      auVar51._12_4_ = -auVar40._12_4_;
      auVar23 = vpermt2ps_avx512vl(auVar40,_DAT_00603510,auVar51);
      fVar50 = 0.0;
      fVar26 = auVar30._0_4_;
      auVar24 = vfmadd231ps_fma(auVar23,auVar35,auVar24);
      auVar24 = vhaddps_avx(auVar24,auVar27);
      fVar37 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
      auVar41._4_4_ = fVar37;
      auVar41._0_4_ = fVar37;
      auVar41._8_4_ = fVar37;
      auVar41._12_4_ = fVar37;
      auVar24 = vshufps_avx(auVar24,auVar24,0xe8);
      auVar21 = vfmadd231ps_fma(auVar24,auVar41,auVar21);
      auVar21 = vandps_avx(auVar21,auVar45);
      auVar11._8_4_ = 0x3c23d70a;
      auVar11._0_8_ = 0x3c23d70a3c23d70a;
      auVar11._12_4_ = 0x3c23d70a;
      uVar4 = vcmpps_avx512vl(auVar21,auVar11,0xe);
      if ((0.0 <= fVar26) && (fVar26 <= 1.0)) {
        auVar24 = vmovshdup_avx(auVar30._0_16_);
        fVar37 = auVar24._0_4_;
        if ((0.0 <= fVar37) && (fVar37 <= 1.0)) {
          auVar24 = vmovshdup_avx(auVar35);
          bVar12 = (byte)(uVar4 >> 1);
          auVar23 = vshufps_avx(auVar21,auVar21,0xf5);
          auVar27 = vmovshdup_avx(auVar38);
          fVar20 = (float)uVar5 - fVar20;
          fVar50 = auVar27._0_4_ - auVar22._0_4_;
          auVar27 = vmovshdup_avx(auVar22);
          fVar1 = fVar1 - auVar27._0_4_;
          auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50)),ZEXT416((uint)fVar20),
                                    ZEXT416((uint)fVar20));
          auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
          auVar27 = vsqrtss_avx(auVar27,auVar27);
          fVar49 = auVar27._0_4_;
          auVar48._0_4_ = fVar50 / fVar49;
          auVar48._4_12_ = SUB6012((undefined1  [60])0x0,0);
          fVar19 = (float)((uint)(bVar12 & 1) * auVar23._0_4_ +
                          (uint)!(bool)(bVar12 & 1) * 0x3c23d70a);
          auVar23 = ZEXT416((uint)(auVar24._0_4_ * (fVar1 / fVar49)));
          auVar27 = vfmadd213ss_fma(auVar48,auVar35,auVar23);
          auVar24 = vfmsub213ss_fma(ZEXT416((uint)(fVar1 / fVar49)),auVar24,auVar23);
          fVar50 = 1.0;
          auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ + auVar24._0_4_)),auVar41,
                                    ZEXT416((uint)(fVar20 / fVar49)));
          auVar24 = vandps_avx(auVar24,auVar45);
          auVar24 = vmaxss_avx(auVar24,SUB6416(ZEXT464(0x3c23d70a),0));
          fVar20 = (float)((uint)((byte)uVar4 & 1) * auVar21._0_4_ +
                          (uint)!(bool)((byte)uVar4 & 1) * 0x3c23d70a);
          fVar1 = fVar19 + fVar19 + fVar20 + auVar24._0_4_;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * (1.0 - fVar37) * fVar19)),
                                      ZEXT416((uint)fVar19),
                                      ZEXT416((uint)((1.0 - fVar26) * (1.0 - fVar37))));
            auVar21 = vfmadd213ss_fma(ZEXT416((uint)fVar20),ZEXT416((uint)(fVar37 * (1.0 - fVar26)))
                                      ,auVar21);
            auVar21 = vfmadd213ss_fma(auVar24,ZEXT416((uint)(fVar26 * fVar37)),auVar21);
            fVar50 = (auVar21._0_4_ * 4.0) / fVar1;
          }
        }
      }
      fVar53 = fVar53 * fVar50;
    }
  }
  return fVar53;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
        Float solidAngle = SolidAngle(ctx.p());
        // Return PDF based on uniform area sampling for challenging triangles
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Intersect sample ray with shape geometry
            Ray ray = ctx.SpawnRay(wi);
            pstd::optional<ShapeIntersection> isect = Intersect(ray);
            CHECK_RARE(1e-6, !isect.has_value());
            if (!isect)
                return 0;

            // Compute PDF in solid angle measure from shape intersection point
            Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
            if (IsInf(pdf))
                pdf = 0;

            return pdf;
        }

        Float pdf = 1 / solidAngle;
        // Adjust PDF for warp product sampling of triangle $\cos \theta$ factor
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Get triangle vertices in _p0_, _p1_, and _p2_
            const TriangleMesh *mesh = GetMesh();
            const int *v = &mesh->vertexIndices[3 * triIndex];
            Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

            Point2f u = InvertSphericalTriangleSample({p0, p1, p2}, ctx.p(), wi);
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            pdf *= BilinearPDF(u, w);
        }

        return pdf;
    }